

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariables
          (BerdyHelper *this,LinkProperAccArray *properAccs,
          LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav,
          LinkNetExternalWrenches *netExtWrenches,LinkInternalWrenches *linkJointWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,VectorDynSize *d)

{
  int iVar1;
  long in_RDI;
  VectorDynSize *in_stack_00000010;
  LinkNetExternalWrenches *in_stack_00000018;
  BerdyHelper *in_stack_00000020;
  bool res;
  JointDOFsDoubleArray *in_stack_00000108;
  LinkInternalWrenches *in_stack_00000110;
  LinkNetExternalWrenches *in_stack_00000118;
  LinkNetTotalWrenchesWithoutGravity *in_stack_00000120;
  LinkProperAccArray *in_stack_00000128;
  BerdyHelper *in_stack_00000130;
  JointDOFsDoubleArray *in_stack_00000140;
  JointDOFsDoubleArray *in_stack_00000148;
  LinkInternalWrenches *in_stack_00000150;
  LinkNetExternalWrenches *in_stack_00000158;
  LinkNetTotalWrenchesWithoutGravity *in_stack_00000160;
  LinkProperAccArray *in_stack_00000168;
  BerdyHelper *in_stack_00000170;
  JointDOFsDoubleArray *in_stack_00000180;
  VectorDynSize *in_stack_00000188;
  bool local_31;
  
  iVar1 = *(int *)(in_RDI + 0x1b0);
  if (iVar1 == 0) {
    local_31 = serializeDynamicVariablesFixedBase
                         (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                          in_stack_00000150,in_stack_00000148,in_stack_00000180,in_stack_00000188);
  }
  else if (iVar1 == 1) {
    local_31 = serializeDynamicVariablesFloatingBase
                         (in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                          in_stack_00000110,in_stack_00000108,in_stack_00000140,
                          (VectorDynSize *)in_stack_00000148);
  }
  else if (iVar1 == 2) {
    local_31 = serializeDynamicVariablesNonCollocatedWrenches
                         (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  else {
    iDynTree::reportError
              ("BerdyHelpers","serializeDynamicVariablesFixedBase","unknown berdy variant");
    local_31 = false;
  }
  return local_31;
}

Assistant:

bool BerdyHelper::serializeDynamicVariables(LinkProperAccArray& properAccs,
                                                     LinkNetTotalWrenchesWithoutGravity& netTotalWrenchesWithoutGrav,
                                                     LinkNetExternalWrenches& netExtWrenches,
                                                     LinkInternalWrenches& linkJointWrenches,
                                                     JointDOFsDoubleArray& jointTorques,
                                                     JointDOFsDoubleArray& jointAccs,
                                                     VectorDynSize& d)
{
    bool res = false;
    switch(m_options.berdyVariant)
    {
        case ORIGINAL_BERDY_FIXED_BASE :
            res = serializeDynamicVariablesFixedBase(properAccs, netTotalWrenchesWithoutGrav, netExtWrenches, linkJointWrenches,
                                                     jointTorques, jointAccs, d);
            break;

        case BERDY_FLOATING_BASE :
            res = serializeDynamicVariablesFloatingBase(properAccs, netTotalWrenchesWithoutGrav, netExtWrenches,
                                                        linkJointWrenches, jointTorques, jointAccs, d);
            break;
        case BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES:
            res = serializeDynamicVariablesNonCollocatedWrenches(netExtWrenches, d);
            break;
        default:
            reportError("BerdyHelpers", "serializeDynamicVariablesFixedBase", "unknown berdy variant");
            assert(false);
            res = false;
    }
    return res;
}